

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O1

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
Distributions::toCDF(Distributions *this,vector<double,_std::allocator<double>_> *distribution)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  vector<double,_std::allocator<double>_> *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pointer *__ptr;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  allocator_type local_21;
  value_type_conflict4 local_20;
  
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(distribution->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3,&local_20,&local_21);
  *(vector<double,_std::allocator<double>_> **)this = this_00;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar5 != 0) {
    pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = (long)pdVar3 - (long)pdVar2 >> 3;
    if (pdVar3 == pdVar2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
    }
    uVar6 = lVar5 >> 3;
    *pdVar2 = *pdVar1;
    if (1 < uVar6) {
      uVar10 = 1;
      uVar11 = 2;
      do {
        uVar8 = (ulong)((int)uVar11 - 2);
        uVar9 = uVar8;
        if ((uVar7 <= uVar8) || (uVar9 = uVar10, uVar7 <= uVar10)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
        }
        pdVar2[uVar10] = pdVar1[uVar10] + pdVar2[uVar8];
        bVar4 = uVar11 < uVar6;
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar4);
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(0) = distribution[0];
	for (unsigned int i=1; i<distribution.size(); ++i) {
		result->at(i) = distribution[i] + result->at(i-1);
	}
	return result;
}